

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxedit.c
# Opt level: O2

WebPMuxError AddDataToChunkList(WebPData *data,int copy_data,uint32_t tag,WebPChunk **chunk_list)

{
  WebPMuxError WVar1;
  WebPChunk chunk;
  
  ChunkInit(&chunk);
  WVar1 = ChunkAssignData(&chunk,data,copy_data,tag);
  if ((WVar1 == WEBP_MUX_OK) && (WVar1 = ChunkSetHead(&chunk,chunk_list), WVar1 == WEBP_MUX_OK)) {
    return WEBP_MUX_OK;
  }
  ChunkRelease(&chunk);
  return WVar1;
}

Assistant:

static WebPMuxError AddDataToChunkList(
    const WebPData* const data, int copy_data, uint32_t tag,
    WebPChunk** chunk_list) {
  WebPChunk chunk;
  WebPMuxError err;
  ChunkInit(&chunk);
  err = ChunkAssignData(&chunk, data, copy_data, tag);
  if (err != WEBP_MUX_OK) goto Err;
  err = ChunkSetHead(&chunk, chunk_list);
  if (err != WEBP_MUX_OK) goto Err;
  return WEBP_MUX_OK;
 Err:
  ChunkRelease(&chunk);
  return err;
}